

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cni.hpp
# Opt level: O1

any __thiscall
cs_impl::
cni_helper<unsigned_long_(*)(const_cs_impl::any_&),_unsigned_long_(*)(const_cs_impl::any_&)>::call
          (cni_helper<unsigned_long_(*)(const_cs_impl::any_&),_unsigned_long_(*)(const_cs_impl::any_&)>
           *this,vector *args)

{
  runtime_error *this_00;
  long *plVar1;
  size_type *psVar2;
  long *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  string local_80;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if (in_RDX[1] - *in_RDX != 8) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x28);
    std::__cxx11::to_string(&local_60,1);
    std::operator+(&local_40,"Wrong size of the arguments. Expected ",&local_60);
    plVar1 = (long *)std::__cxx11::string::append((char *)&local_40);
    local_c0._M_dataplus._M_p = (pointer)*plVar1;
    psVar2 = (size_type *)(plVar1 + 2);
    if ((size_type *)local_c0._M_dataplus._M_p == psVar2) {
      local_c0.field_2._M_allocated_capacity = *psVar2;
      local_c0.field_2._8_8_ = plVar1[3];
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    }
    else {
      local_c0.field_2._M_allocated_capacity = *psVar2;
    }
    local_c0._M_string_length = plVar1[1];
    *plVar1 = (long)psVar2;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    std::__cxx11::to_string(&local_80,in_RDX[1] - *in_RDX >> 3);
    std::operator+(&local_a0,&local_c0,&local_80);
    cs::runtime_error::runtime_error(this_00,&local_a0);
    __cxa_throw(this_00,&cs::runtime_error::typeinfo,cs::runtime_error::~runtime_error);
  }
  if ((args->super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    local_a0._M_dataplus._M_p =
         (pointer)(*(code *)args[1].super__Vector_base<cs_impl::any,_std::allocator<cs_impl::any>_>.
                            _M_impl.super__Vector_impl_data._M_start)(args);
    any::make_constant<unsigned_long,unsigned_long_const&>((any *)this,(unsigned_long *)&local_a0);
    return (any)(proxy *)this;
  }
  std::__throw_bad_function_call();
}

Assistant:

any call(cs::vector &args) const
		{
			if (args.size() != sizeof...(_Target_ArgsT))
				throw cs::runtime_error(
				    "Wrong size of the arguments. Expected " + std::to_string(sizeof...(_Target_ArgsT)) +
				    ", provided " +
				    std::to_string(args.size()));
			return return_to_cs(_call(args, cov::make_sequence<sizeof...(_Source_ArgsT)>::result));
		}